

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O2

void Assimp::ExportSceneStep
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 uVar3;
  DeadlyImportError *this;
  allocator<char> local_3c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  string file;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  ExportProperties props;
  StepExporter iDoTheExportThing;
  long *plVar2;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iDoTheExportThing,pFile,(allocator<char> *)&props);
  DefaultIOSystem::absolutePath(&path,(string *)&iDoTheExportThing);
  std::__cxx11::string::~string((string *)&iDoTheExportThing);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iDoTheExportThing,pFile,(allocator<char> *)&props);
  DefaultIOSystem::completeBaseName(&file,(string *)&iDoTheExportThing);
  std::__cxx11::string::~string((string *)&iDoTheExportThing);
  ExportProperties::ExportProperties(&props,pProperties);
  StepExporter::StepExporter(&iDoTheExportThing,pScene,pIOSystem,&path,&file,&props);
  iVar1 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    std::__cxx11::stringbuf::str();
    uVar3 = std::ostream::tellp();
    (**(code **)(*plVar2 + 0x18))(plVar2,local_3c8._M_dataplus._M_p,uVar3,1);
    std::__cxx11::string::~string((string *)&local_3c8);
    (**(code **)(*plVar2 + 8))(plVar2);
    StepExporter::~StepExporter(&iDoTheExportThing);
    ExportProperties::~ExportProperties(&props);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::~string((string *)&path);
    return;
  }
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,pFile,&local_3c9);
  std::operator+(&local_3c8,"could not open output .stp file: ",&local_368);
  DeadlyImportError::DeadlyImportError(this,&local_3c8);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneStep(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties)
{
    std::string path = DefaultIOSystem::absolutePath(std::string(pFile));
    std::string file = DefaultIOSystem::completeBaseName(std::string(pFile));

    // create/copy Properties
    ExportProperties props(*pProperties);

    // invoke the exporter
    StepExporter iDoTheExportThing( pScene, pIOSystem, path, file, &props);

    // we're still here - export successfully completed. Write result to the given IOSYstem
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .stp file: " + std::string(pFile));
    }

    // XXX maybe use a small wrapper around IOStream that behaves like std::stringstream in order to avoid the extra copy.
    outfile->Write( iDoTheExportThing.mOutput.str().c_str(), static_cast<size_t>(iDoTheExportThing.mOutput.tellp()),1);
}